

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sslexeme.cpp
# Opt level: O1

int IsStringInt(char *str)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar5 = 0;
  if ((str != (char *)0x0) && (uVar5 = 0, *str != '\0')) {
    sVar2 = strlen(str);
    bVar6 = sVar2 != 0;
    if (bVar6) {
      if (*str == '-' || (byte)(*str - 0x30U) < 10) {
        uVar3 = 0;
        do {
          if (sVar2 - 1 == uVar3) goto LAB_00109033;
          lVar1 = uVar3 + 1;
          uVar3 = uVar3 + 1;
        } while (str[lVar1] == '-' || (byte)(str[lVar1] - 0x30U) < 10);
        bVar6 = uVar3 < sVar2;
      }
      if (bVar6) {
        return 0;
      }
    }
LAB_00109033:
    bVar6 = sVar2 < 2;
    if ((!bVar6) && (str[1] != '-')) {
      uVar3 = 2;
      do {
        uVar4 = uVar3;
        if (sVar2 == uVar4) break;
        uVar3 = uVar4 + 1;
      } while (str[uVar4] != '-');
      bVar6 = sVar2 <= uVar4;
    }
    uVar5 = (uint)bVar6;
  }
  return uVar5;
}

Assistant:

int IsStringInt(const char* str)
{
    if (!str)
        return FALSE;

    if (strlen(str) == 0)
        return FALSE;

    for (int i = 0; i < strlen(str); i++)
    {
        if (!IsCharNumeric(str[i]) && str[i] != '-')
            return FALSE;
    }

    for (int i = 1; i < strlen(str); i++)
    {
        if (str[i] == '-')
            return FALSE;
    }

	return TRUE;
}